

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool __thiscall httplib::Server::routing(Server *this,Request *req,Response *res)

{
  bool bVar1;
  Response *res_local;
  Request *req_local;
  Server *this_local;
  
  bVar1 = std::operator==(&req->method,"GET");
  if ((bVar1) && (bVar1 = handle_file_request(this,req,res), bVar1)) {
    this_local._7_1_ = true;
  }
  else {
    bVar1 = std::operator==(&req->method,"GET");
    if ((bVar1) || (bVar1 = std::operator==(&req->method,"HEAD"), bVar1)) {
      this_local._7_1_ = dispatch_request(this,req,res,&this->get_handlers_);
    }
    else {
      bVar1 = std::operator==(&req->method,"POST");
      if (bVar1) {
        this_local._7_1_ = dispatch_request(this,req,res,&this->post_handlers_);
      }
      else {
        bVar1 = std::operator==(&req->method,"PUT");
        if (bVar1) {
          this_local._7_1_ = dispatch_request(this,req,res,&this->put_handlers_);
        }
        else {
          bVar1 = std::operator==(&req->method,"DELETE");
          if (bVar1) {
            this_local._7_1_ = dispatch_request(this,req,res,&this->delete_handlers_);
          }
          else {
            bVar1 = std::operator==(&req->method,"OPTIONS");
            if (bVar1) {
              this_local._7_1_ = dispatch_request(this,req,res,&this->options_handlers_);
            }
            else {
              this_local._7_1_ = false;
            }
          }
        }
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

inline bool Server::routing(Request& req, Response& res)
{
    if (req.method == "GET" && handle_file_request(req, res)) {
        return true;
    }

    if (req.method == "GET" || req.method == "HEAD") {
        return dispatch_request(req, res, get_handlers_);
    } else if (req.method == "POST") {
        return dispatch_request(req, res, post_handlers_);
    } else if (req.method == "PUT") {
        return dispatch_request(req, res, put_handlers_);
    } else if (req.method == "DELETE") {
        return dispatch_request(req, res, delete_handlers_);
    } else if (req.method == "OPTIONS") {
        return dispatch_request(req, res, options_handlers_);
    }
    return false;
}